

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEvaluator.cpp
# Opt level: O0

void __thiscall simpleExpressionEvaluator::ExpressionEvaluator::_parse(ExpressionEvaluator *this)

{
  ostream *poVar1;
  allocator<char> local_39;
  string local_38;
  double local_18;
  double result;
  ExpressionEvaluator *this_local;
  
  result = (double)this;
  local_18 = _expr(this);
  if (this->_token == 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"The result is : ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Tokens after end of expression.",&local_39);
    _error(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  return;
}

Assistant:

void ExpressionEvaluator::_parse()
{
	/* parse -> expr '\n' */

	auto result = _expr();
	if (_token == '\0')
		cout << "The result is : " << result << endl << endl;
	else
		_error("Tokens after end of expression.");
}